

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic.c
# Opt level: O3

int picnic_write_private_key(picnic_privatekey_t *key,uint8_t *buf,size_t buflen)

{
  size_t __n;
  picnic_instance_t *ppVar1;
  size_t sVar2;
  
  sVar2 = 0xffffffff;
  if (buf != (uint8_t *)0x0 && key != (picnic_privatekey_t *)0x0) {
    ppVar1 = picnic_instance_get((uint)key->data[0]);
    if ((ppVar1 != (picnic_instance_t *)0x0) &&
       (__n = (ulong)ppVar1->input_output_size * 3 + 1, __n <= buflen)) {
      memcpy(buf,key,__n);
      sVar2 = __n;
    }
  }
  return (int)sVar2;
}

Assistant:

int PICNIC_CALLING_CONVENTION picnic_write_private_key(const picnic_privatekey_t* key, uint8_t* buf,
                                                       size_t buflen) {
  if (!key || !buf) {
    return -1;
  }

  const picnic_params_t param       = key->data[0];
  const picnic_instance_t* instance = picnic_instance_get(param);
  if (!instance) {
    return -1;
  }

  const size_t bytes_required = 1 + 3 * instance->input_output_size;
  if (buflen < bytes_required) {
    return -1;
  }

  memcpy(buf, &key->data, bytes_required);
  return (int)bytes_required;
}